

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O0

void Fl_Tooltip::current(Fl_Widget *w)

{
  Fl_Widget *pFVar1;
  char *pcVar2;
  Fl_Group *local_18;
  Fl_Widget *tw;
  Fl_Widget *w_local;
  
  exit_((Fl_Widget *)0x0);
  local_18 = (Fl_Group *)w;
  while ((pFVar1 = widget_, local_18 != (Fl_Group *)0x0 &&
         (pcVar2 = Fl_Widget::tooltip(&local_18->super_Fl_Widget), pFVar1 = w, pcVar2 == (char *)0x0
         ))) {
    local_18 = Fl_Widget::parent(&local_18->super_Fl_Widget);
  }
  widget_ = pFVar1;
  return;
}

Assistant:

void Fl_Tooltip::current(Fl_Widget* w) {
#ifdef DEBUG
  printf("Fl_Tooltip::current(w=%p)\n", w);
#endif // DEBUG

  exit_(0);
  // find the enclosing group with a tooltip:
  Fl_Widget* tw = w;
  for (;;) {
    if (!tw) return;
    if (tw->tooltip()) break;
    tw = tw->parent();
  }
  // act just like Fl_Tooltip::enter_() except we can remember a zero:
  widget_ = w;
}